

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::TableDeathTest_EraseOfEndAsserts_Test::
~TableDeathTest_EraseOfEndAsserts_Test(TableDeathTest_EraseOfEndAsserts_Test *this)

{
  TableDeathTest_EraseOfEndAsserts_Test *this_local;
  
  ~TableDeathTest_EraseOfEndAsserts_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TableDeathTest, EraseOfEndAsserts) {
  // Use an assert with side-effects to figure out if they are actually enabled.
  bool assert_enabled = false;
  assert([&]() {
    assert_enabled = true;
    return true;
  }());
  if (!assert_enabled) return;

  IntTable t;
  // Extra simple "regexp" as regexp support is highly varied across platforms.
  constexpr char kDeathMsg[] = "it != end";
  EXPECT_DEATH_IF_SUPPORTED(t.erase(t.end()), kDeathMsg);
}